

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O2

void __thiscall tcu::x11::XlibDisplay::processEvent(XlibDisplay *this,XEvent *event)

{
  if ((event->type == 0x21) && ((ulong)(uint)(event->xexpose).count == this->m_deleteAtom)) {
    EventState::setQuitFlag((this->super_DisplayBase).m_eventState,true);
    return;
  }
  return;
}

Assistant:

void XlibDisplay::processEvent (XEvent& event)
{
	switch (event.type)
	{
		case ClientMessage:
			if ((unsigned)event.xclient.data.l[0] == m_deleteAtom)
				m_eventState.setQuitFlag(true);
			break;
		// note: ConfigureNotify for window is handled in setDimensions()
		default:
			break;
	}
}